

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::Statistics::initLevel(Statistics *this,uint32 level)

{
  SolverStats *this_00;
  ClaspFacade *pCVar1;
  ulong uVar2;
  
  pCVar1 = this->self_;
  if (this->level_ < level) {
    if ((1 < (pCVar1->accu_).ptr_) && ((this->solvers_).multi == (SolverStats *)0x0)) {
      this_00 = (SolverStats *)operator_new(0x40);
      SolverStats::SolverStats(this_00);
      (this->solvers_).multi = this_00;
      pCVar1 = this->self_;
    }
    this->level_ = level;
  }
  uVar2 = (pCVar1->ctx).sccGraph.ptr_ & 0xfffffffffffffffe;
  if (((uVar2 != 0) && (*(int *)(uVar2 + 0x28) != 0)) && (this->tester_ == (TesterStats *)0x0)) {
    this->tester_ = *(TesterStats **)(uVar2 + 0x30);
  }
  return;
}

Assistant:

void ClaspFacade::Statistics::initLevel(uint32 level) {
	if (level_ < level) {
		if (incremental() && !solvers_.multi) { solvers_.multi = new SolverStats(); }
		level_ = level;
	}
	if (self_->ctx.sccGraph.get() && self_->ctx.sccGraph->numNonHcfs() && !tester_) {
		tester_ = self_->ctx.sccGraph->nonHcfStats();
	}
}